

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
MXNetNode::attr_ai(vector<int,_std::allocator<int>_> *__return_storage_ptr__,MXNetNode *this,
                  char *key)

{
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  long lVar4;
  int nconsumed;
  int i;
  
  std::__cxx11::string::string((string *)&i,key,(allocator *)&nconsumed);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->attrs)._M_t,(key_type *)&i);
  std::__cxx11::string::~string((string *)&i);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((_Rb_tree_header *)cVar3._M_node != &(this->attrs)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = is_attr_scalar(this,key);
    if (bVar1) {
      i = attr_i(this,key);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&i);
    }
    else {
      i = 0;
      nconsumed = 0;
      iVar2 = __isoc99_sscanf(*(undefined8 *)(cVar3._M_node + 2),"%*[\\[(,]%d%n");
      bVar1 = true;
      if (iVar2 != 1) {
        iVar2 = strncmp(*(char **)(cVar3._M_node + 2),"(None",5);
        if (iVar2 == 0) {
          i = -0xe9;
          nconsumed = 5;
        }
        else {
          bVar1 = false;
        }
      }
      lVar4 = 0;
      while (bVar1) {
        std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&i);
        i = 0;
        lVar4 = (long)(int)lVar4 + (long)nconsumed;
        iVar2 = __isoc99_sscanf(*(long *)(cVar3._M_node + 2) + lVar4,"%*[(,]%d%n",&i,&nconsumed);
        bVar1 = true;
        if (iVar2 != 1) {
          iVar2 = strncmp((char *)(lVar4 + *(long *)(cVar3._M_node + 2)),", None",6);
          bVar1 = false;
          if (iVar2 == 0) {
            i = -0xe9;
            nconsumed = 6;
            bVar1 = true;
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> MXNetNode::attr_ai(const char* key) const
{
    const std::map<std::string, std::string>::const_iterator it = attrs.find(key);
    if (it == attrs.end())
        return std::vector<int>();

    // (1,2,3)
    std::vector<int> list;

    if (is_attr_scalar(key))
    {
        list.push_back(attr_i(key));
        return list;
    }

    int i = 0;
    int c = 0;
    int nconsumed = 0;
    int nscan = sscanf(it->second.c_str() + c, "%*[\\[(,]%d%n", &i, &nconsumed);
    if (nscan != 1)
    {
        // (None
        if (strncmp(it->second.c_str() + c, "(None", 5) == 0)
        {
            i = -233;
            nconsumed = 5;
            nscan = 1;
        }
    }
    while (nscan == 1)
    {
        list.push_back(i);
        //         fprintf(stderr, "%d\n", i);

        i = 0;
        c += nconsumed;
        nscan = sscanf(it->second.c_str() + c, "%*[(,]%d%n", &i, &nconsumed);
        if (nscan != 1)
        {
            // , None
            if (strncmp(it->second.c_str() + c, ", None", 6) == 0)
            {
                i = -233;
                nconsumed = 6;
                nscan = 1;
            }
        }
    }

    return list;
}